

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> * __thiscall
kj::ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::operator=
          (ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *this,
          ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *other)

{
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *other_local;
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Dependency *)0x0;
  other->pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)0x0;
  other->endPtr = (Dependency *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }